

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O2

void UpdateBits(size_t n_bits,uint32_t bits,size_t pos,uint8_t *array)

{
  sbyte sVar1;
  byte bVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = CONCAT44(in_register_00000034,bits);
  for (uVar6 = 0x14; uVar6 != 0; uVar6 = uVar6 - uVar3) {
    uVar5 = (uint)uVar4 & 7;
    uVar3 = 8 - (ulong)uVar5;
    if (uVar6 < uVar3) {
      uVar3 = uVar6;
    }
    sVar1 = (sbyte)uVar5;
    bVar2 = (byte)uVar3;
    *(byte *)(pos + (uVar4 >> 3)) =
         (byte)((~(-1 << (bVar2 & 0x1f)) & (uint)n_bits) << sVar1) |
         *(byte *)(pos + (uVar4 >> 3)) &
         ((byte)(-1 << sVar1) ^ 0xff | (byte)(-1 << (sVar1 + bVar2 & 0x1f)));
    n_bits = (size_t)((uint)n_bits >> (bVar2 & 0x1f));
    uVar4 = uVar4 + uVar3;
  }
  return;
}

Assistant:

static void UpdateBits(size_t n_bits, uint32_t bits, size_t pos,
    uint8_t* array) {
  while (n_bits > 0) {
    size_t byte_pos = pos >> 3;
    size_t n_unchanged_bits = pos & 7;
    size_t n_changed_bits = BROTLI_MIN(size_t, n_bits, 8 - n_unchanged_bits);
    size_t total_bits = n_unchanged_bits + n_changed_bits;
    uint32_t mask =
        (~((1u << total_bits) - 1u)) | ((1u << n_unchanged_bits) - 1u);
    uint32_t unchanged_bits = array[byte_pos] & mask;
    uint32_t changed_bits = bits & ((1u << n_changed_bits) - 1u);
    array[byte_pos] =
        (uint8_t)((changed_bits << n_unchanged_bits) | unchanged_bits);
    n_bits -= n_changed_bits;
    bits >>= n_changed_bits;
    pos += n_changed_bits;
  }
}